

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::declareStruct
          (HlslParseContext *this,TSourceLoc *loc,TString *structName,TType *type)

{
  _Rb_tree_header *p_Var1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  TTypeList *this_00;
  TTypeList *this_01;
  bool bVar3;
  bool bVar4;
  int iVar5;
  TVariable *this_02;
  TTypeList *pTVar6;
  TTypeList *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  mapped_type *pmVar9;
  TTypeList **list;
  TTypeList **list_00;
  TTypeList **list_01;
  TTypeList **list_02;
  TTypeList **list_03;
  TTypeList **list_04;
  TSourceLoc *s;
  HlslParseContext *pHVar10;
  pointer pTVar11;
  const_iterator local_f0;
  TMap<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>_>
  *local_e8;
  anon_class_8_1_60e67bd8 newMember;
  tIoKinds newLists;
  TTypeLoc newUniformMember;
  TTypeList *local_80;
  anon_class_8_1_60e67bd8 inheritStruct;
  TTypeLoc newOutputMember;
  TTypeLoc newInputMember;
  
  s = loc;
  iVar5 = (*type->_vptr_TType[7])(type);
  if ((iVar5 != 0x10) && (structName->_M_string_length != 0)) {
    this_02 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
    TVariable::TVariable(this_02,structName,type,true);
    bVar3 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_02);
    if (!bVar3) {
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      (*UNRECOVERED_JUMPTABLE)
                (this,loc,"redefinition",(structName->_M_dataplus)._M_p,"struct",
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    newLists.input = (TTypeList *)0x0;
    newLists.output = (TTypeList *)0x0;
    newLists.uniform = (TTypeList *)0x0;
    pTVar6 = TType::getStruct(type);
    pTVar11 = (pTVar6->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
              .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar3 = (bool)((char)&newLists + '\b');
    local_e8 = &this->ioTypeMap;
    p_Var1 = &(this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    while( true ) {
      pTVar7 = TType::getStruct(type);
      this_01 = newLists.uniform;
      this_00 = newLists.output;
      pTVar6 = newLists.input;
      if (pTVar11 ==
          (pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl
          .super__Vector_impl_data._M_finish) break;
      pHVar10 = (HlslParseContext *)pTVar11->type;
      iVar5 = (*(pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
      bVar4 = hasUniform(pHVar10,(TQualifier *)CONCAT44(extraout_var,iVar5));
      declareStruct::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)bVar4,(bool)((char)&newLists + '\x10'),list);
      iVar5 = (*pTVar11->type->_vptr_TType[10])();
      bVar4 = hasInput(this,(TQualifier *)CONCAT44(extraout_var_00,iVar5));
      declareStruct::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)bVar4,SUB81(&newLists,0),list_00);
      iVar5 = (*pTVar11->type->_vptr_TType[10])();
      bVar4 = hasOutput(this,(TQualifier *)CONCAT44(extraout_var_01,iVar5));
      declareStruct::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)bVar4,bVar3,list_01);
      iVar5 = (*pTVar11->type->_vptr_TType[0x25])();
      if ((char)iVar5 != '\0') {
        newUniformMember.type = (TType *)TType::getStruct(pTVar11->type);
        iVar8 = std::
                _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ::find((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                        *)local_e8,(key_type *)&newUniformMember);
        if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
          declareStruct::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(ulong)(iVar8._M_node[1]._M_right != (_Base_ptr)0x0)
                     ,(bool)((char)&newLists + '\x10'),list_02);
          declareStruct::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     (ulong)(iVar8._M_node[1]._M_parent != (_Base_ptr)0x0),SUB81(&newLists,0),
                     list_03);
          declareStruct::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(ulong)(iVar8._M_node[1]._M_left != (_Base_ptr)0x0),
                     bVar3,list_04);
        }
      }
      pTVar11 = pTVar11 + 1;
    }
    if ((newLists.uniform == (TTypeList *)0x0 && newLists.input == (TTypeList *)0x0) &&
        newLists.output == (TTypeList *)0x0) {
      pTVar6 = TType::getStruct(type);
      pTVar11 = (pTVar6->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        pTVar6 = TType::getStruct(type);
        if (pTVar11 ==
            (pTVar6->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pHVar10 = (HlslParseContext *)pTVar11->type;
        iVar5 = (*(pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])
                          ();
        clearUniformInputOutput(pHVar10,(TQualifier *)CONCAT44(extraout_var_02,iVar5));
        pTVar11 = pTVar11 + 1;
      }
    }
    else {
      pTVar7 = TType::getStruct(type);
      local_f0._M_current =
           (pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        pTVar7 = TType::getStruct(type);
        if (local_f0._M_current ==
            (pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        newUniformMember.type = (TType *)0x0;
        newMember.member = &local_f0;
        newUniformMember.loc.column = ((local_f0._M_current)->loc).column;
        newUniformMember.loc._20_4_ = *(undefined4 *)&((local_f0._M_current)->loc).field_0x14;
        newUniformMember.loc.name = ((local_f0._M_current)->loc).name;
        newUniformMember.loc.string = ((local_f0._M_current)->loc).string;
        newUniformMember.loc.line = ((local_f0._M_current)->loc).line;
        newInputMember.type = (TType *)0x0;
        newInputMember.loc.column = ((local_f0._M_current)->loc).column;
        newInputMember.loc._20_4_ = *(undefined4 *)&((local_f0._M_current)->loc).field_0x14;
        newInputMember.loc.name = ((local_f0._M_current)->loc).name;
        newInputMember.loc.string = ((local_f0._M_current)->loc).string;
        newInputMember.loc.line = ((local_f0._M_current)->loc).line;
        newOutputMember.type = (TType *)0x0;
        newOutputMember.loc.column = ((local_f0._M_current)->loc).column;
        newOutputMember.loc._20_4_ = *(undefined4 *)&((local_f0._M_current)->loc).field_0x14;
        newOutputMember.loc.name._0_4_ = *(undefined4 *)&((local_f0._M_current)->loc).name;
        newOutputMember.loc.name._4_4_ =
             *(undefined4 *)((long)&((local_f0._M_current)->loc).name + 4);
        newOutputMember.loc.string = ((local_f0._M_current)->loc).string;
        newOutputMember.loc.line = ((local_f0._M_current)->loc).line;
        inheritStruct.member = newMember.member;
        iVar5 = (*(local_f0._M_current)->type->_vptr_TType[0x25])();
        if ((char)iVar5 != '\0') {
          local_80 = TType::getStruct((local_f0._M_current)->type);
          iVar8 = std::
                  _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                  ::find((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          *)local_e8,&local_80);
          if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      (&inheritStruct,(TTypeList *)iVar8._M_node[1]._M_right,&newUniformMember);
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      (&inheritStruct,(TTypeList *)iVar8._M_node[1]._M_parent,&newInputMember);
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      (&inheritStruct,(TTypeList *)iVar8._M_node[1]._M_left,&newOutputMember);
          }
        }
        if (this_01 != (TTypeList *)0x0) {
          declareStruct::anon_class_8_1_60e67bd8::operator()(&newMember,&newUniformMember);
          iVar5 = (*(local_f0._M_current)->type->_vptr_TType[0x1c])();
          if ((char)iVar5 != '\0') {
            iVar5 = (*(local_f0._M_current)->type->_vptr_TType[10])();
            if (*(ulong *)(CONCAT44(extraout_var_03,iVar5) + 8) < 0x2000000000000000) {
              uVar2 = *(ulong *)&(this->globalUniformDefaults).field_0x8;
              iVar5 = (*(newUniformMember.type)->_vptr_TType[10])();
              *(ulong *)(CONCAT44(extraout_var_04,iVar5) + 8) =
                   *(ulong *)(CONCAT44(extraout_var_04,iVar5) + 8) & 0x1fffffffffffffff |
                   uVar2 & 0xe000000000000000;
            }
          }
          pHVar10 = (HlslParseContext *)newUniformMember.type;
          iVar5 = (*(newUniformMember.type)->_vptr_TType[10])();
          correctUniform(pHVar10,(TQualifier *)CONCAT44(extraout_var_05,iVar5));
          std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                    (&this_01->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                     &newUniformMember);
        }
        if (pTVar6 != (TTypeList *)0x0) {
          declareStruct::anon_class_8_1_60e67bd8::operator()(&newMember,&newInputMember);
          iVar5 = (*(newInputMember.type)->_vptr_TType[10])();
          correctInput(this,(TQualifier *)CONCAT44(extraout_var_06,iVar5));
          std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                    (&pTVar6->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                     &newInputMember);
        }
        if (this_00 != (TTypeList *)0x0) {
          declareStruct::anon_class_8_1_60e67bd8::operator()(&newMember,&newOutputMember);
          iVar5 = (*(newOutputMember.type)->_vptr_TType[10])();
          correctOutput(this,(TQualifier *)CONCAT44(extraout_var_07,iVar5));
          std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                    (&this_00->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                     &newOutputMember);
        }
        pHVar10 = (HlslParseContext *)(local_f0._M_current)->type;
        iVar5 = (*(pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])
                          ();
        clearUniformInputOutput(pHVar10,(TQualifier *)CONCAT44(extraout_var_08,iVar5));
        local_f0._M_current = local_f0._M_current + 1;
      }
      newUniformMember.type = (TType *)TType::getStruct(type);
      pmVar9 = std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::operator[](&local_e8->
                             super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                            ,(key_type *)&newUniformMember);
      pmVar9->input = newLists.input;
      pmVar9->output = newLists.output;
      pmVar9->uniform = newLists.uniform;
    }
  }
  return;
}

Assistant:

void HlslParseContext::declareStruct(const TSourceLoc& loc, TString& structName, TType& type)
{
    // If it was named, which means the type can be reused later, add
    // it to the symbol table.  (Unless it's a block, in which
    // case the name is not a type.)
    if (type.getBasicType() == EbtBlock || structName.size() == 0)
        return;

    TVariable* userTypeDef = new TVariable(&structName, type, true);
    if (! symbolTable.insert(*userTypeDef)) {
        error(loc, "redefinition", structName.c_str(), "struct");
        return;
    }

    // See if we need IO aliases for the structure typeList

    const auto condAlloc = [](bool pred, TTypeList*& list) {
        if (pred && list == nullptr)
            list = new TTypeList;
    };

    tIoKinds newLists = { nullptr, nullptr, nullptr }; // allocate for each kind found
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        condAlloc(hasUniform(member->type->getQualifier()), newLists.uniform);
        condAlloc(  hasInput(member->type->getQualifier()), newLists.input);
        condAlloc( hasOutput(member->type->getQualifier()), newLists.output);

        if (member->type->isStruct()) {
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                condAlloc(it->second.uniform != nullptr, newLists.uniform);
                condAlloc(it->second.input   != nullptr, newLists.input);
                condAlloc(it->second.output  != nullptr, newLists.output);
            }
        }
    }
    if (newLists.uniform == nullptr &&
        newLists.input   == nullptr &&
        newLists.output  == nullptr) {
        // Won't do any IO caching, clear up the type and get out now.
        for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member)
            clearUniformInputOutput(member->type->getQualifier());
        return;
    }

    // We have IO involved.

    // Make a pure typeList for the symbol table, and cache side copies of IO versions.
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        const auto inheritStruct = [&](TTypeList* s, TTypeLoc& ioMember) {
            if (s != nullptr) {
                ioMember.type = new TType;
                ioMember.type->shallowCopy(*member->type);
                ioMember.type->setStruct(s);
            }
        };
        const auto newMember = [&](TTypeLoc& m) {
            if (m.type == nullptr) {
                m.type = new TType;
                m.type->shallowCopy(*member->type);
            }
        };

        TTypeLoc newUniformMember = { nullptr, member->loc };
        TTypeLoc newInputMember   = { nullptr, member->loc };
        TTypeLoc newOutputMember  = { nullptr, member->loc };
        if (member->type->isStruct()) {
            // swap in an IO child if there is one
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                inheritStruct(it->second.uniform, newUniformMember);
                inheritStruct(it->second.input,   newInputMember);
                inheritStruct(it->second.output,  newOutputMember);
            }
        }
        if (newLists.uniform) {
            newMember(newUniformMember);

            // inherit default matrix layout (changeable via #pragma pack_matrix), if none given.
            if (member->type->isMatrix() && member->type->getQualifier().layoutMatrix == ElmNone)
                newUniformMember.type->getQualifier().layoutMatrix = globalUniformDefaults.layoutMatrix;

            correctUniform(newUniformMember.type->getQualifier());
            newLists.uniform->push_back(newUniformMember);
        }
        if (newLists.input) {
            newMember(newInputMember);
            correctInput(newInputMember.type->getQualifier());
            newLists.input->push_back(newInputMember);
        }
        if (newLists.output) {
            newMember(newOutputMember);
            correctOutput(newOutputMember.type->getQualifier());
            newLists.output->push_back(newOutputMember);
        }

        // make original pure
        clearUniformInputOutput(member->type->getQualifier());
    }
    ioTypeMap[type.getStruct()] = newLists;
}